

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O2

bool __thiscall QMimeData::hasUrls(QMimeData *this)

{
  int iVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  textUriListLiteral();
  iVar1 = (*(this->super_QObject)._vptr_QObject[0xc])(this,&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return SUB41(iVar1,0);
  }
  __stack_chk_fail();
}

Assistant:

bool QMimeData::hasUrls() const
{
    return hasFormat(textUriListLiteral());
}